

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O1

JSAMPARRAY alloc_sarray(j_common_ptr cinfo,int pool_id,JDIMENSION samplesperrow,JDIMENSION numrows)

{
  jpeg_memory_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  JSAMPARRAY ppJVar5;
  JSAMPROW pJVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  pjVar1 = cinfo->mem;
  uVar10 = CONCAT44(0,samplesperrow);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar10;
  uVar4 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x3b9ac9e8)) / auVar3,0);
  if (0x3b9ac9e8 < samplesperrow) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x48;
    (*pjVar2->error_exit)(cinfo);
  }
  if (numrows <= uVar4) {
    uVar4 = (ulong)numrows;
  }
  *(int *)&pjVar1[1].access_virt_sarray = (int)uVar4;
  ppJVar5 = (JSAMPARRAY)alloc_small(cinfo,pool_id,(ulong)numrows << 3);
  if (numrows != 0) {
    uVar9 = 0;
    do {
      uVar11 = (ulong)(numrows - uVar9);
      if ((uint)uVar4 < numrows - uVar9) {
        uVar11 = uVar4;
      }
      pJVar6 = (JSAMPROW)alloc_large(cinfo,pool_id,uVar11 * uVar10);
      uVar7 = (uint)uVar11;
      uVar4 = uVar11;
      while (uVar7 != 0) {
        uVar8 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
        ppJVar5[uVar8] = pJVar6;
        pJVar6 = pJVar6 + uVar10;
        uVar7 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar7;
      }
      uVar4 = uVar11;
    } while (uVar9 < numrows);
  }
  return ppJVar5;
}

Assistant:

METHODDEF(JSAMPARRAY)
alloc_sarray (j_common_ptr cinfo, int pool_id,
	      JDIMENSION samplesperrow, JDIMENSION numrows)
/* Allocate a 2-D sample array */
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  JSAMPARRAY result;
  JSAMPROW workspace;
  JDIMENSION rowsperchunk, currow, i;
  long ltemp;

  /* Calculate max # of rows allowed in one allocation chunk */
  ltemp = (MAX_ALLOC_CHUNK-SIZEOF(large_pool_hdr)) /
	  ((long) samplesperrow * SIZEOF(JSAMPLE));
  if (ltemp <= 0)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
  if (ltemp < (long) numrows)
    rowsperchunk = (JDIMENSION) ltemp;
  else
    rowsperchunk = numrows;
  mem->last_rowsperchunk = rowsperchunk;

  /* Get space for row pointers (small object) */
  result = (JSAMPARRAY) alloc_small(cinfo, pool_id,
				    (size_t) (numrows * SIZEOF(JSAMPROW)));

  /* Get the rows themselves (large objects) */
  currow = 0;
  while (currow < numrows) {
    rowsperchunk = MIN(rowsperchunk, numrows - currow);
    workspace = (JSAMPROW) alloc_large(cinfo, pool_id,
	(size_t) ((size_t) rowsperchunk * (size_t) samplesperrow
		  * SIZEOF(JSAMPLE)));
    for (i = rowsperchunk; i > 0; i--) {
      result[currow++] = workspace;
      workspace += samplesperrow;
    }
  }

  return result;
}